

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

string * __thiscall
pbrt::Interval<double>::ToString_abi_cxx11_(string *__return_storage_ptr__,Interval<double> *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<double_const&,double_const&>
            (__return_storage_ptr__,"[ Interval [%f, %f] ]",&this->low,&this->high);
  return __return_storage_ptr__;
}

Assistant:

std::string Interval<Float>::ToString() const {
    return StringPrintf("[ Interval [%f, %f] ]", low, high);
}